

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.cpp
# Opt level: O0

void __thiscall tli_window_manager::TableBox::TableBox(TableBox *this,int rows,int cols)

{
  size_type __n;
  size_type __n_00;
  allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>
  local_76;
  allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_> local_75 [13];
  int local_68 [2];
  pair<int,_int> local_60;
  pair<int,_int> local_58;
  pair<std::nullptr_t,_std::pair<int,_int>_> local_50;
  pair<tli_window_manager::Box_*,_std::pair<int,_int>_> local_40;
  vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
  local_30;
  int local_18;
  int local_14;
  int cols_local;
  int rows_local;
  TableBox *this_local;
  
  local_18 = cols;
  local_14 = rows;
  _cols_local = this;
  Box::Box(&this->super_Box);
  (this->super_Box)._vptr_Box = (_func_int **)&PTR_layout_00114b88;
  this->rows_ = local_14;
  this->cols_ = local_18;
  __n = (size_type)local_14;
  __n_00 = (size_type)local_18;
  local_58.first = 0;
  local_58.second = 0;
  local_68[1] = 0;
  local_68[0] = 0;
  local_60 = std::make_pair<int,int>(local_68 + 1,local_68);
  std::make_pair<decltype(nullptr),std::pair<int,int>>(&local_50.first,&local_58);
  std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>::
  pair<std::nullptr_t,_std::pair<int,_int>,_true>(&local_40,&local_50);
  std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>::allocator(local_75);
  std::
  vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
  ::vector(&local_30,__n_00,&local_40,local_75);
  std::
  allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>
  ::allocator(&local_76);
  std::
  vector<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>,_std::allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>_>
  ::vector(&this->table_,__n,&local_30,&local_76);
  std::
  allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>
  ::~allocator(&local_76);
  std::
  vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
  ::~vector(&local_30);
  std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>::~allocator(local_75);
  return;
}

Assistant:

TableBox::TableBox(int rows, int cols) : rows_{rows}, cols_{cols}, table_(rows, std::vector<std::pair<Box *, Position>>(
        cols, std::make_pair(nullptr, std::make_pair(0, 0))
)) {}